

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# leave.hpp
# Opt level: O2

void __thiscall
soplex::SPxSolverBase<double>::getLeaveVals
          (SPxSolverBase<double> *this,int leaveIdx,Status *leaveStat,SPxId *leaveId,
          double *leaveMax,double *leavebound,int *leaveNum,StableSum<double> *objChange)

{
  SPxBasisBase<double> *this_00;
  DataKey DVar1;
  int iVar2;
  Status SVar3;
  long lVar4;
  double *pdVar5;
  SPxInternalCodeException *pSVar6;
  pointer pdVar7;
  Status *pSVar8;
  double dVar9;
  allocator local_71;
  double *local_70;
  double *local_68;
  double local_60;
  string local_58;
  double local_38;
  
  this_00 = &this->super_SPxBasisBase<double>;
  DVar1 = (this->super_SPxBasisBase<double>).theBaseId.data[leaveIdx].super_DataKey;
  leaveId->super_DataKey = DVar1;
  local_70 = leavebound;
  local_68 = leaveMax;
  if (DVar1.info < 0) {
    SPxRowId::SPxRowId((SPxRowId *)&local_58,leaveId);
    iVar2 = ClassSet<soplex::SVSetBase<double>::DLPSV>::number
                      (&(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.
                        super_SVSetBase<double>.set,(DataKey *)&local_58);
    *leaveNum = iVar2;
    pSVar8 = (this->super_SPxBasisBase<double>).thedesc.rowstat.data;
    SVar3 = pSVar8[iVar2];
    *leaveStat = SVar3;
    switch(SVar3) {
    case D_FREE:
      pSVar8[iVar2] = P_FIXED;
      *local_70 = -(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.right.val.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[iVar2];
      goto LAB_001c1952;
    case D_ON_UPPER:
      pSVar8[iVar2] = P_ON_LOWER;
      dVar9 = (this->super_SPxLPBase<double>).super_LPRowSetBase<double>.left.val.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start[iVar2];
      break;
    case D_ON_LOWER:
      pSVar8[iVar2] = P_ON_UPPER;
      dVar9 = (this->super_SPxLPBase<double>).super_LPRowSetBase<double>.right.val.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start[iVar2];
LAB_001c1a8d:
      *local_70 = -dVar9;
      pdVar5 = (double *)infinity();
      *local_68 = *pdVar5;
      lVar4 = (long)*leaveNum;
      dVar9 = (this->theLRbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[lVar4];
      pdVar7 = (this->super_SPxLPBase<double>).super_LPRowSetBase<double>.right.val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start;
      goto LAB_001c1ac5;
    case D_ON_BOTH:
      dVar9 = (this->theFvec->super_VectorBase<double>).val.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start[leaveIdx];
      pdVar5 = (this->theLBbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start + leaveIdx;
      if (dVar9 < *pdVar5 || dVar9 == *pdVar5) {
        pSVar8[iVar2] = P_ON_UPPER;
        pdVar5 = (double *)infinity();
        iVar2 = *leaveNum;
        (this->theURbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[iVar2] = *pdVar5;
        dVar9 = (this->super_SPxLPBase<double>).super_LPRowSetBase<double>.right.val.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start[iVar2];
        goto LAB_001c1a8d;
      }
      pSVar8[iVar2] = P_ON_LOWER;
      pdVar5 = (double *)infinity();
      iVar2 = *leaveNum;
      (this->theLRbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[iVar2] = -*pdVar5;
      dVar9 = (this->super_SPxLPBase<double>).super_LPRowSetBase<double>.left.val.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start[iVar2];
      break;
    case P_ON_LOWER:
      SVar3 = SPxBasisBase<double>::dualRowStatus(this_00,iVar2);
      iVar2 = *leaveNum;
      pSVar8 = (this->super_SPxBasisBase<double>).thedesc.rowstat.data;
      goto LAB_001c1728;
    default:
      pSVar6 = (SPxInternalCodeException *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string
                ((string *)&local_58,"XLEAVE02 This should never happen.",&local_71);
      SPxInternalCodeException::SPxInternalCodeException(pSVar6,&local_58);
      __cxa_throw(pSVar6,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
    case P_ON_UPPER:
      SVar3 = SPxBasisBase<double>::dualRowStatus(this_00,iVar2);
      iVar2 = *leaveNum;
      pSVar8 = (this->super_SPxBasisBase<double>).thedesc.rowstat.data;
      goto LAB_001c188b;
    case P_FREE:
      pSVar6 = (SPxInternalCodeException *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string
                ((string *)&local_58,"XLEAVE01 This should never happen.",&local_71);
      SPxInternalCodeException::SPxInternalCodeException(pSVar6,&local_58);
      __cxa_throw(pSVar6,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
    }
    *local_70 = -dVar9;
    pdVar5 = (double *)infinity();
    *local_68 = -*pdVar5;
    lVar4 = (long)*leaveNum;
    dVar9 = (this->theURbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[lVar4];
    pdVar7 = (this->super_SPxLPBase<double>).super_LPRowSetBase<double>.left.val.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
LAB_001c1ac5:
    StableSum<double>::operator+=(objChange,dVar9 * pdVar7[lVar4]);
    return;
  }
  SPxColId::SPxColId((SPxColId *)&local_58,leaveId);
  iVar2 = ClassSet<soplex::SVSetBase<double>::DLPSV>::number
                    (&(this->super_SPxLPBase<double>).super_LPColSetBase<double>.
                      super_SVSetBase<double>.set,(DataKey *)&local_58);
  *leaveNum = iVar2;
  pSVar8 = (this->super_SPxBasisBase<double>).thedesc.colstat.data;
  SVar3 = pSVar8[iVar2];
  *leaveStat = SVar3;
  switch(SVar3) {
  case D_FREE:
    pSVar8[iVar2] = P_FIXED;
    dVar9 = (this->super_SPxLPBase<double>).super_LPColSetBase<double>.up.val.
            super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_start[iVar2];
    *local_70 = dVar9;
    StableSum<double>::operator+=
              (objChange,
               dVar9 * (this->super_SPxLPBase<double>).super_LPColSetBase<double>.object.val.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[iVar2]);
LAB_001c1952:
    local_70 = (double *)
               (this->theLBbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[leaveIdx];
    local_60 = (this->theFvec->super_VectorBase<double>).val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start[leaveIdx];
    pdVar5 = (double *)infinity();
    dVar9 = *pdVar5;
    if ((double)local_70 <= local_60) goto LAB_001c1994;
    goto LAB_001c1af7;
  case D_ON_UPPER:
    pSVar8[iVar2] = P_ON_LOWER;
    dVar9 = (this->super_SPxLPBase<double>).super_LPColSetBase<double>.low.val.
            super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_start[iVar2];
    *local_70 = dVar9;
    StableSum<double>::operator+=
              (objChange,
               dVar9 * (this->theLCbound).val.super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_start[iVar2]);
    break;
  case D_ON_LOWER:
    pSVar8[iVar2] = P_ON_UPPER;
    dVar9 = (this->super_SPxLPBase<double>).super_LPColSetBase<double>.up.val.
            super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_start[iVar2];
    *local_70 = dVar9;
    StableSum<double>::operator+=
              (objChange,
               dVar9 * (this->theUCbound).val.super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_start[iVar2]);
LAB_001c1912:
    pdVar5 = (double *)infinity();
    dVar9 = *pdVar5;
LAB_001c1994:
    *local_68 = -dVar9;
    return;
  case D_ON_BOTH:
    local_60 = (this->theFvec->super_VectorBase<double>).val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start[leaveIdx];
    local_38 = (this->theUBbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[leaveIdx];
    pdVar5 = (double *)infinity();
    if (local_38 < local_60) {
      *local_68 = -*pdVar5;
      iVar2 = *leaveNum;
      dVar9 = (this->super_SPxLPBase<double>).super_LPColSetBase<double>.up.val.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start[iVar2];
      *local_70 = dVar9;
      StableSum<double>::operator+=
                (objChange,
                 dVar9 * (this->theUCbound).val.super__Vector_base<double,_std::allocator<double>_>.
                         _M_impl.super__Vector_impl_data._M_start[iVar2]);
      pdVar5 = (double *)infinity();
      iVar2 = *leaveNum;
      (this->theLCbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[iVar2] = -*pdVar5;
      (this->super_SPxBasisBase<double>).thedesc.colstat.data[iVar2] = P_ON_UPPER;
      return;
    }
    *local_68 = *pdVar5;
    iVar2 = *leaveNum;
    dVar9 = (this->super_SPxLPBase<double>).super_LPColSetBase<double>.low.val.
            super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_start[iVar2];
    *local_70 = dVar9;
    StableSum<double>::operator+=
              (objChange,
               dVar9 * (this->theLCbound).val.super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_start[iVar2]);
    pdVar5 = (double *)infinity();
    iVar2 = *leaveNum;
    (this->theUCbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[iVar2] = *pdVar5;
    (this->super_SPxBasisBase<double>).thedesc.colstat.data[iVar2] = P_ON_LOWER;
    return;
  case P_ON_LOWER:
    SVar3 = SPxBasisBase<double>::dualColStatus(this_00,iVar2);
    iVar2 = *leaveNum;
    pSVar8 = (this->super_SPxBasisBase<double>).thedesc.colstat.data;
LAB_001c1728:
    pSVar8[iVar2] = SVar3;
    *local_70 = 0.0;
    break;
  default:
    pSVar6 = (SPxInternalCodeException *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string((string *)&local_58,"XLEAVE03 This should never happen.",&local_71)
    ;
    SPxInternalCodeException::SPxInternalCodeException(pSVar6,&local_58);
    __cxa_throw(pSVar6,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
  case P_ON_UPPER:
    SVar3 = SPxBasisBase<double>::dualColStatus(this_00,iVar2);
    iVar2 = *leaveNum;
    pSVar8 = (this->super_SPxBasisBase<double>).thedesc.colstat.data;
LAB_001c188b:
    pSVar8[iVar2] = SVar3;
    *local_70 = 0.0;
    goto LAB_001c1912;
  case P_FREE:
    SVar3 = SPxBasisBase<double>::dualColStatus(this_00,iVar2);
    (this->super_SPxBasisBase<double>).thedesc.colstat.data[*leaveNum] = SVar3;
    dVar9 = (this->theLBbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[leaveIdx];
    pdVar5 = (this->theFvec->super_VectorBase<double>).val.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start + leaveIdx;
    if (*pdVar5 <= dVar9 && dVar9 != *pdVar5) {
      *local_70 = dVar9;
      goto LAB_001c1912;
    }
    *local_70 = (this->theUBbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[leaveIdx];
  }
  pdVar5 = (double *)infinity();
  dVar9 = *pdVar5;
LAB_001c1af7:
  *local_68 = dVar9;
  return;
}

Assistant:

void SPxSolverBase<R>::getLeaveVals(
   int leaveIdx,
   typename SPxBasisBase<R>::Desc::Status& leaveStat,
   SPxId& leaveId,
   R& leaveMax,
   R& leavebound,
   int& leaveNum,
   StableSum<R>& objChange)
{
   typename SPxBasisBase<R>::Desc& ds = this->desc();
   leaveId = this->baseId(leaveIdx);

   if(leaveId.isSPxRowId())
   {
      leaveNum = this->number(SPxRowId(leaveId));
      leaveStat = ds.rowStatus(leaveNum);

      assert(isBasic(leaveStat));

      switch(leaveStat)
      {
      case SPxBasisBase<R>::Desc::P_ON_UPPER :
         assert(rep() == ROW);
         ds.rowStatus(leaveNum) = this->dualRowStatus(leaveNum);
         leavebound = 0;
         leaveMax = R(-infinity);
         break;

      case SPxBasisBase<R>::Desc::P_ON_LOWER :
         assert(rep() == ROW);
         ds.rowStatus(leaveNum) = this->dualRowStatus(leaveNum);
         leavebound = 0;
         leaveMax = R(infinity);
         break;

      case SPxBasisBase<R>::Desc::P_FREE :
         assert(rep() == ROW);
         throw SPxInternalCodeException("XLEAVE01 This should never happen.");

      case SPxBasisBase<R>::Desc::D_FREE :
         assert(rep() == COLUMN);
         ds.rowStatus(leaveNum) = SPxBasisBase<R>::Desc::P_FIXED;
         assert(this->lhs(leaveNum) == this->rhs(leaveNum));
         leavebound = -this->rhs(leaveNum);

         if((*theFvec)[leaveIdx] < theLBbound[leaveIdx])
            leaveMax = R(infinity);
         else
            leaveMax = R(-infinity);

         break;

      case SPxBasisBase<R>::Desc::D_ON_LOWER :
         assert(rep() == COLUMN);
         ds.rowStatus(leaveNum) = SPxBasisBase<R>::Desc::P_ON_UPPER;
         leavebound = -this->rhs(leaveNum);                // slack !!
         leaveMax = R(infinity);
         objChange += theLRbound[leaveNum] * this->rhs(leaveNum);
         break;

      case SPxBasisBase<R>::Desc::D_ON_UPPER :
         assert(rep() == COLUMN);
         ds.rowStatus(leaveNum) = SPxBasisBase<R>::Desc::P_ON_LOWER;
         leavebound = -this->lhs(leaveNum);                // slack !!
         leaveMax = R(-infinity);
         objChange += theURbound[leaveNum] * this->lhs(leaveNum);
         break;

      case SPxBasisBase<R>::Desc::D_ON_BOTH :
         assert(rep() == COLUMN);

         if((*theFvec)[leaveIdx] > theLBbound[leaveIdx])
         {
            ds.rowStatus(leaveNum) = SPxBasisBase<R>::Desc::P_ON_LOWER;
            theLRbound[leaveNum] = R(-infinity);
            leavebound = -this->lhs(leaveNum);            // slack !!
            leaveMax = R(-infinity);
            objChange += theURbound[leaveNum] * this->lhs(leaveNum);
         }
         else
         {
            ds.rowStatus(leaveNum) = SPxBasisBase<R>::Desc::P_ON_UPPER;
            theURbound[leaveNum] = R(infinity);
            leavebound = -this->rhs(leaveNum);            // slack !!
            leaveMax = R(infinity);
            objChange += theLRbound[leaveNum] * this->rhs(leaveNum);
         }

         break;

      default:
         throw SPxInternalCodeException("XLEAVE02 This should never happen.");
      }

      SPxOut::debug(this, "DLEAVE51 SPxSolverBase<R>::getLeaveVals() : row {} : {} -> {} objChange: {}\n",
                    leaveNum, leaveStat, ds.rowStatus(leaveNum), objChange);
   }

   else
   {
      assert(leaveId.isSPxColId());
      leaveNum = this->number(SPxColId(leaveId));
      leaveStat = ds.colStatus(leaveNum);

      assert(isBasic(leaveStat));

      switch(leaveStat)
      {
      case SPxBasisBase<R>::Desc::P_ON_UPPER :
         assert(rep() == ROW);
         ds.colStatus(leaveNum) = this->dualColStatus(leaveNum);
         leavebound = 0;
         leaveMax = R(-infinity);
         break;

      case SPxBasisBase<R>::Desc::P_ON_LOWER :
         assert(rep() == ROW);
         ds.colStatus(leaveNum) = this->dualColStatus(leaveNum);
         leavebound = 0;
         leaveMax = R(infinity);
         break;

      case SPxBasisBase<R>::Desc::P_FREE :
         assert(rep() == ROW);
         ds.colStatus(leaveNum) = this->dualColStatus(leaveNum);

         if((*theFvec)[leaveIdx] < theLBbound[leaveIdx])
         {
            leavebound = theLBbound[leaveIdx];
            leaveMax = R(-infinity);
         }
         else
         {
            leavebound = theUBbound[leaveIdx];
            leaveMax = R(infinity);
         }

         break;

      case SPxBasisBase<R>::Desc::D_FREE :
         assert(rep() == COLUMN);
         assert(SPxLPBase<R>::upper(leaveNum) == SPxLPBase<R>::lower(leaveNum));
         ds.colStatus(leaveNum) = SPxBasisBase<R>::Desc::P_FIXED;
         leavebound = SPxLPBase<R>::upper(leaveNum);
         objChange += this->maxObj(leaveNum) * leavebound;

         if((*theFvec)[leaveIdx] < theLBbound[leaveIdx])
            leaveMax = R(infinity);
         else
            leaveMax = R(-infinity);

         break;

      case SPxBasisBase<R>::Desc::D_ON_LOWER :
         assert(rep() == COLUMN);
         ds.colStatus(leaveNum) = SPxBasisBase<R>::Desc::P_ON_UPPER;
         leavebound = SPxLPBase<R>::upper(leaveNum);
         objChange += theUCbound[leaveNum] * leavebound;
         leaveMax = R(-infinity);
         break;

      case SPxBasisBase<R>::Desc::D_ON_UPPER :
         assert(rep() == COLUMN);
         ds.colStatus(leaveNum) = SPxBasisBase<R>::Desc::P_ON_LOWER;
         leavebound = SPxLPBase<R>::lower(leaveNum);
         objChange += theLCbound[leaveNum] * leavebound;
         leaveMax = R(infinity);
         break;

      case SPxBasisBase<R>::Desc::D_ON_BOTH :
         assert(rep() == COLUMN);

         if((*theFvec)[leaveIdx] > theUBbound[leaveIdx])
         {
            leaveMax = R(-infinity);
            leavebound = SPxLPBase<R>::upper(leaveNum);
            objChange += theUCbound[leaveNum] * leavebound;
            theLCbound[leaveNum] = R(-infinity);
            ds.colStatus(leaveNum) = SPxBasisBase<R>::Desc::P_ON_UPPER;
         }
         else
         {
            leaveMax = R(infinity);
            leavebound = SPxLPBase<R>::lower(leaveNum);
            objChange += theLCbound[leaveNum] * leavebound;
            theUCbound[leaveNum] = R(infinity);
            ds.colStatus(leaveNum) = SPxBasisBase<R>::Desc::P_ON_LOWER;
         }

         break;

      default:
         throw SPxInternalCodeException("XLEAVE03 This should never happen.");
      }

      SPxOut::debug(this, "DLEAVE52 SPxSolverBase<R>::getLeaveVals() : col {} : {} -> {} objChange: {}\n",
                    leaveNum, leaveStat, ds.colStatus(leaveNum), objChange);
   }
}